

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetLinkDirectories
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language)

{
  cmMakefile *this_00;
  string *psVar1;
  cmLocalGenerator *this_01;
  pointer this_02;
  bool *pbVar2;
  pointer pEVar3;
  pointer pEVar4;
  pointer pEVar5;
  bool bVar6;
  PolicyStatus PVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  string *psVar9;
  ostream *poVar10;
  string *psVar11;
  undefined8 *puVar12;
  cmake *this_03;
  string *psVar13;
  long *plVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  long *plVar16;
  size_type *psVar17;
  PolicyID id;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_04;
  MessageType t;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar18;
  string local_378;
  undefined4 local_354;
  string usedDirectories;
  long *local_320;
  long local_318;
  long local_310 [2];
  pointer local_300;
  cmListFileBacktrace *local_2f8;
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  long local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  EvaluatedTargetPropertyEntries entries;
  string local_280;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250 [6];
  ios_base local_1f0 [264];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueDirectories;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uniqueDirectories._M_h._M_buckets = &uniqueDirectories._M_h._M_single_bucket;
  uniqueDirectories._M_h._M_bucket_count = 1;
  uniqueDirectories._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  uniqueDirectories._M_h._M_element_count = 0;
  uniqueDirectories._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  uniqueDirectories._M_h._M_rehash_policy._M_next_resize = 0;
  uniqueDirectories._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"LINK_DIRECTORIES","");
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,this,&local_280,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this->Makefile;
  _e = (pointer)local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&e,"CMAKE_DEBUG_TARGET_PROPERTIES","");
  cmMakefile::GetDefExpandList(this_00,(string *)&e,&debugProperties,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_e != local_250) {
    operator_delete(_e,local_250[0]._M_allocated_capacity + 1);
  }
  if (this->DebugLinkDirectoriesDone == false) {
    _Var8 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[17]>>
                      (debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"LINK_DIRECTORIES");
    local_354 = (undefined4)
                CONCAT71((int7)((ulong)_Var8._M_current >> 8),
                         _Var8._M_current !=
                         debugProperties.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    local_354 = 0;
  }
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    this->DebugLinkDirectoriesDone = true;
  }
  anon_unknown.dwarf_1dbda9e::EvaluateTargetPropertyEntries
            (&entries,this,config,language,&dagChecker,&this->LinkDirectoriesEntries);
  _e = (pointer)local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&e,"INTERFACE_LINK_DIRECTORIES","");
  PVar7 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0099);
  anon_unknown.dwarf_1dbda9e::AddInterfaceEntries
            (this,config,(string *)&e,language,&dagChecker,&entries,Yes,(uint)(PVar7 == NEW));
  pEVar3 = entries.Entries.
           super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar4 = entries.Entries.
           super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_e != local_250) {
    operator_delete(_e,local_250[0]._M_allocated_capacity + 1);
    pEVar3 = entries.Entries.
             super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pEVar4 = entries.Entries.
             super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  do {
    pEVar5 = entries.Entries.
             super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar6 = pEVar3 == entries.Entries.
                      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    entries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar4;
    if (bVar6) {
LAB_004af1ff:
      if (entries.Entries.
          super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          entries.Entries.
          super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        this_04 = &(entries.Entries.
                    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start)->Values;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this_04);
          this_02 = (pointer)(((EvaluatedTargetPropertyEntry *)(this_04 + -1))->Backtrace).
                             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
          if (this_02 != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
          }
          pbVar2 = (bool *)(this_04 + 1);
          this_04 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&this_04[2].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
        } while ((pointer)(pbVar2 + 8) !=
                 entries.Entries.
                 super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (entries.Entries.
          super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(entries.Entries.
                        super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)entries.Entries.
                              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)entries.Entries.
                              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&debugProperties);
      if (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&dagChecker.Seen._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
        operator_delete(dagChecker.Property._M_dataplus._M_p,
                        dagChecker.Property.field_2._M_allocated_capacity + 1);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&uniqueDirectories._M_h);
      return __return_storage_ptr__;
    }
    psVar9 = cmLinkItem::AsStr_abi_cxx11_(&pEVar3->LinkImplItem->super_cmLinkItem);
    usedDirectories._M_dataplus._M_p = (pointer)&usedDirectories.field_2;
    usedDirectories._M_string_length = 0;
    usedDirectories.field_2._M_local_buf[0] = '\0';
    psVar13 = (pEVar3->Values).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (pEVar3->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_300 = pEVar3;
    if (psVar13 != psVar1) {
      local_2f8 = &pEVar3->Backtrace;
      do {
        bVar6 = cmsys::SystemTools::FileIsFullPath(psVar13);
        if (!bVar6) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          if (psVar9->_M_string_length == 0) {
            PVar7 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0081);
            t = FATAL_ERROR;
            if (PVar7 == OLD) {
              bVar6 = true;
            }
            else {
              if (PVar7 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_378,(cmPolicies *)0x51,id);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&e,local_378._M_dataplus._M_p,
                                     local_378._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_378._M_dataplus._M_p != &local_378.field_2) {
                  operator_delete(local_378._M_dataplus._M_p,
                                  local_378.field_2._M_allocated_capacity + 1);
                }
                t = AUTHOR_WARNING;
              }
              bVar6 = false;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&e,"Found relative path while evaluating link directories of \"",
                       0x3a);
            psVar11 = cmTarget::GetName_abi_cxx11_(this->Target);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&e,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length
                                );
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\":\n  \"",6);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(psVar13->_M_dataplus)._M_p,psVar13->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"\n",2);
            if (!bVar6) goto LAB_004aedb4;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&e,"Target \"",8);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&e,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"\" contains relative path in its INTERFACE_LINK_DIRECTORIES:\n  \"",
                       0x3f);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(psVar13->_M_dataplus)._M_p,psVar13->_M_string_length);
            t = FATAL_ERROR;
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
LAB_004aedb4:
            this_01 = this->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(this_01,t,&local_378);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1
                             );
            }
            if (t == FATAL_ERROR) {
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
              std::ios_base::~ios_base(local_1f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)usedDirectories._M_dataplus._M_p != &usedDirectories.field_2) {
                operator_delete(usedDirectories._M_dataplus._M_p,
                                CONCAT71(usedDirectories.field_2._M_allocated_capacity._1_7_,
                                         usedDirectories.field_2._M_local_buf[0]) + 1);
              }
              goto LAB_004af1ff;
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          std::ios_base::~ios_base(local_1f0);
        }
        cmsys::SystemTools::ConvertToUnixSlashes(psVar13);
        _e = (pointer)&uniqueDirectories;
        pVar18 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::
                 _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)_e,psVar13,(string *)&e);
        if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     __return_storage_ptr__,psVar13,local_2f8);
          if ((char)local_354 != '\0') {
            std::operator+(&local_378," * ",psVar13);
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
            _e = (pointer)local_250;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 == paVar15) {
              local_250[0]._0_8_ = paVar15->_M_allocated_capacity;
              local_250[0]._8_8_ = puVar12[3];
            }
            else {
              local_250[0]._0_8_ = paVar15->_M_allocated_capacity;
              _e = (pointer)*puVar12;
            }
            *puVar12 = paVar15;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&usedDirectories,(ulong)_e);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_e != local_250) {
              operator_delete(_e,local_250[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        psVar13 = psVar13 + 1;
      } while (psVar13 != psVar1);
      if (usedDirectories._M_string_length != 0) {
        this_03 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        local_320 = local_310;
        local_2d0 = 0x21;
        local_320 = (long *)std::__cxx11::string::_M_create((ulong *)&local_320,(ulong)&local_2d0);
        local_310[0] = local_2d0;
        local_320[2] = 0x6f6620736569726f;
        local_320[3] = 0x7465677261742072;
        *local_320 = 0x6e696c2064657355;
        local_320[1] = 0x746365726964206b;
        *(char *)(local_320 + 4) = ' ';
        local_318 = local_2d0;
        *(char *)((long)local_320 + local_2d0) = '\0';
        psVar13 = cmTarget::GetName_abi_cxx11_(this->Target);
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_320,(ulong)(psVar13->_M_dataplus)._M_p);
        local_2f0 = &local_2e0;
        plVar16 = plVar14 + 2;
        if ((long *)*plVar14 == plVar16) {
          local_2e0 = *plVar16;
          lStack_2d8 = plVar14[3];
        }
        else {
          local_2e0 = *plVar16;
          local_2f0 = (long *)*plVar14;
        }
        local_2e8 = plVar14[1];
        *plVar14 = (long)plVar16;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_2f0);
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        psVar17 = (size_type *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_378.field_2._M_allocated_capacity = *psVar17;
          local_378.field_2._8_8_ = plVar14[3];
        }
        else {
          local_378.field_2._M_allocated_capacity = *psVar17;
          local_378._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_378._M_string_length = plVar14[1];
        *plVar14 = (long)psVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_378,(ulong)usedDirectories._M_dataplus._M_p);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 == paVar15) {
          local_250[0]._0_8_ = paVar15->_M_allocated_capacity;
          local_250[0]._8_8_ = puVar12[3];
          _e = (pointer)local_250;
        }
        else {
          local_250[0]._0_8_ = paVar15->_M_allocated_capacity;
          _e = (pointer)*puVar12;
        }
        *puVar12 = paVar15;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        cmake::IssueMessage(this_03,LOG,(string *)&e,local_2f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_250) {
          operator_delete(_e,local_250[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,local_2e0 + 1);
        }
        if (local_320 != local_310) {
          operator_delete(local_320,local_310[0] + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)usedDirectories._M_dataplus._M_p != &usedDirectories.field_2) {
      operator_delete(usedDirectories._M_dataplus._M_p,
                      CONCAT71(usedDirectories.field_2._M_allocated_capacity._1_7_,
                               usedDirectories.field_2._M_local_buf[0]) + 1);
    }
    pEVar3 = local_300 + 1;
    pEVar4 = entries.Entries.
             super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    entries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar5;
  } while( true );
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetLinkDirectories(
  std::string const& config, std::string const& language) const
{
  std::vector<BT<std::string>> result;
  std::unordered_set<std::string> uniqueDirectories;

  cmGeneratorExpressionDAGChecker dagChecker(this, "LINK_DIRECTORIES", nullptr,
                                             nullptr);

  std::vector<std::string> debugProperties;
  this->Makefile->GetDefExpandList("CMAKE_DEBUG_TARGET_PROPERTIES",
                                   debugProperties);

  bool debugDirectories = !this->DebugLinkDirectoriesDone &&
    cm::contains(debugProperties, "LINK_DIRECTORIES");

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugLinkDirectoriesDone = true;
  }

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, language, &dagChecker, this->LinkDirectoriesEntries);

  AddInterfaceEntries(this, config, "INTERFACE_LINK_DIRECTORIES", language,
                      &dagChecker, entries, IncludeRuntimeInterface::Yes,
                      this->GetPolicyStatusCMP0099() == cmPolicies::NEW
                        ? LinkInterfaceFor::Link
                        : LinkInterfaceFor::Usage);

  processLinkDirectories(this, entries, result, uniqueDirectories,
                         debugDirectories);

  return result;
}